

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::UniversalTextureEvaluator::operator()
          (UniversalTextureEvaluator *this,SpectrumTextureHandle tex,TextureEvalContext ctx,
          SampledWavelengths lambda)

{
  SampledSpectrum SVar1;
  DispatchSplit<10> local_71;
  ulong local_70;
  float local_68 [2];
  float afStack_60 [2];
  float afStack_58 [2];
  float afStack_50 [2];
  Tuple3<pbrt::Point3,_float> local_48 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_30 [4];
  
  local_48[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_48[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_48[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_48[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_48[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_48[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_30[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_30[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_30[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_30[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_30[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_30[1].z = ctx.dudx;
  aTStack_30[2].x = ctx.dudy;
  aTStack_30[2].y = ctx.dvdx;
  aTStack_30[2].z = ctx.dvdy;
  aTStack_30[3].x = (float)ctx.faceIndex;
  local_68[0] = lambda.lambda.values[0];
  local_68[1] = lambda.lambda.values[1];
  afStack_60[0] = lambda.lambda.values[2];
  afStack_60[1] = lambda.lambda.values[3];
  afStack_58[0] = lambda.pdf.values[0];
  afStack_58[1] = lambda.pdf.values[1];
  afStack_50[0] = lambda.pdf.values[2];
  afStack_50[1] = lambda.pdf.values[3];
  local_70 = *(ulong *)tex.
                       super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                       .bits;
  SVar1 = DispatchSplit<10>::operator()(&local_71,local_48,local_68,&local_70,local_70 >> 0x30);
  return (array<float,_4>)(array<float,_4>)SVar1;
}

Assistant:

SampledSpectrum UniversalTextureEvaluator::operator()(SpectrumTextureHandle tex,
                                                      TextureEvalContext ctx,
                                                      SampledWavelengths lambda) {
    return tex.Evaluate(ctx, lambda);
}